

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prolog.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  Clause *pCVar2;
  _func_int *p_Var3;
  Atom *f;
  Atom *f_00;
  Term *pTVar4;
  _func_int **pp_Var5;
  Term *pTVar6;
  Compound *pCVar7;
  Term *a2;
  Term *a3;
  Compound *pCVar8;
  Compound *pCVar9;
  Compound *this;
  Clause *pCVar10;
  Goal *pGVar11;
  Variable *a1;
  Variable *a2_00;
  Program *pPVar12;
  Program *pPVar13;
  VarMapping *vars_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  allocator<char> local_18a;
  allocator<char> local_189;
  Program *local_188;
  Goal *local_180;
  Term *local_178;
  Compound *local_170;
  Clause *local_168;
  Clause *local_160;
  Term *local_158;
  Term *local_150;
  Variable *vars [2];
  string names [2];
  _func_int *local_f0;
  _func_int *local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  _func_int *p_Stack_d8;
  _func_int *local_d0;
  _func_int *local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  _func_int *p_Stack_b8;
  _func_int *local_b0;
  _func_int *local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  _func_int *p_Stack_98;
  _func_int *local_90;
  _func_int *local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  _func_int *p_Stack_78;
  pointer local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  pointer local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  f = (Atom *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"app",(allocator<char> *)names);
  paVar14 = &(f->atomname).field_2;
  (f->atomname)._M_dataplus._M_p = (pointer)paVar14;
  if (local_50 == &local_40) {
    paVar14->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    *(undefined8 *)((long)&(f->atomname).field_2 + 8) = uStack_38;
  }
  else {
    (f->atomname)._M_dataplus._M_p = local_50;
    (f->atomname).field_2._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
  }
  (f->atomname)._M_string_length = local_48;
  local_48 = 0;
  local_40 = '\0';
  local_50 = &local_40;
  std::__cxx11::string::~string((string *)&local_50);
  f_00 = (Atom *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"cons",(allocator<char> *)names);
  paVar14 = &(f_00->atomname).field_2;
  (f_00->atomname)._M_dataplus._M_p = (pointer)paVar14;
  if (local_70 == &local_60) {
    paVar14->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    *(undefined8 *)((long)&(f_00->atomname).field_2 + 8) = uStack_58;
  }
  else {
    (f_00->atomname)._M_dataplus._M_p = local_70;
    (f_00->atomname).field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
  }
  (f_00->atomname)._M_string_length = local_68;
  local_68 = 0;
  local_60 = '\0';
  local_70 = &local_60;
  std::__cxx11::string::~string((string *)&local_70);
  pTVar4 = (Term *)operator_new(0x20);
  pp_Var5 = (_func_int **)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"nil",(allocator<char> *)names);
  p_Var3 = local_88;
  *pp_Var5 = (_func_int *)(pp_Var5 + 2);
  if (local_90 == (_func_int *)&local_80) {
    pp_Var5[2] = (_func_int *)CONCAT71(uStack_7f,local_80);
    pp_Var5[3] = p_Stack_78;
  }
  else {
    *pp_Var5 = local_90;
    pp_Var5[2] = (_func_int *)CONCAT71(uStack_7f,local_80);
  }
  local_88 = (_func_int *)0x0;
  pp_Var5[1] = p_Var3;
  pTVar4->_vptr_Term = (_func_int **)&PTR_copy_00105d80;
  pTVar4[1]._vptr_Term = pp_Var5;
  *(undefined4 *)&pTVar4[2]._vptr_Term = 0;
  local_80 = (_func_int)0x0;
  pTVar4[3]._vptr_Term = (_func_int **)0x0;
  local_90 = (_func_int *)&local_80;
  std::__cxx11::string::~string((string *)&local_90);
  local_188 = (Program *)operator_new(0x20);
  pp_Var5 = (_func_int **)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"1",(allocator<char> *)names);
  *pp_Var5 = (_func_int *)(pp_Var5 + 2);
  if (local_b0 == (_func_int *)&local_a0) {
    pp_Var5[2] = (_func_int *)CONCAT71(uStack_9f,local_a0);
    pp_Var5[3] = p_Stack_98;
  }
  else {
    *pp_Var5 = local_b0;
    pp_Var5[2] = (_func_int *)CONCAT71(uStack_9f,local_a0);
  }
  pp_Var5[1] = local_a8;
  local_a8 = (_func_int *)0x0;
  local_188->head = (Clause *)&PTR_copy_00105d80;
  ((Term *)((long)local_188 + 8))->_vptr_Term = pp_Var5;
  *(undefined4 *)&((Term *)((long)local_188 + 0x10))->_vptr_Term = 0;
  local_a0 = (_func_int)0x0;
  ((Term *)((long)local_188 + 0x18))->_vptr_Term = (_func_int **)0x0;
  local_b0 = (_func_int *)&local_a0;
  std::__cxx11::string::~string((string *)&local_b0);
  pTVar6 = (Term *)operator_new(0x20);
  pp_Var5 = (_func_int **)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"2",(allocator<char> *)names);
  *pp_Var5 = (_func_int *)(pp_Var5 + 2);
  if (local_d0 == (_func_int *)&local_c0) {
    pp_Var5[2] = (_func_int *)CONCAT71(uStack_bf,local_c0);
    pp_Var5[3] = p_Stack_b8;
  }
  else {
    *pp_Var5 = local_d0;
    pp_Var5[2] = (_func_int *)CONCAT71(uStack_bf,local_c0);
  }
  pp_Var5[1] = local_c8;
  local_c8 = (_func_int *)0x0;
  pTVar6->_vptr_Term = (_func_int **)&PTR_copy_00105d80;
  pTVar6[1]._vptr_Term = pp_Var5;
  *(undefined4 *)&pTVar6[2]._vptr_Term = 0;
  local_c0 = (_func_int)0x0;
  pTVar6[3]._vptr_Term = (_func_int **)0x0;
  local_d0 = (_func_int *)&local_c0;
  std::__cxx11::string::~string((string *)&local_d0);
  local_178 = (Term *)operator_new(0x20);
  pp_Var5 = (_func_int **)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"3",(allocator<char> *)names);
  *pp_Var5 = (_func_int *)(pp_Var5 + 2);
  if (local_f0 == (_func_int *)&local_e0) {
    pp_Var5[2] = (_func_int *)CONCAT71(uStack_df,local_e0);
    pp_Var5[3] = p_Stack_d8;
  }
  else {
    *pp_Var5 = local_f0;
    pp_Var5[2] = (_func_int *)CONCAT71(uStack_df,local_e0);
  }
  pp_Var5[1] = local_e8;
  local_e8 = (_func_int *)0x0;
  local_178->_vptr_Term = (_func_int **)&PTR_copy_00105d80;
  local_178[1]._vptr_Term = pp_Var5;
  *(undefined4 *)&local_178[2]._vptr_Term = 0;
  local_e0 = (_func_int)0x0;
  local_178[3]._vptr_Term = (_func_int **)0x0;
  local_158 = pTVar6;
  local_f0 = (_func_int *)&local_e0;
  std::__cxx11::string::~string((string *)&local_f0);
  pTVar6 = (Term *)operator_new(0x18);
  pTVar6->_vptr_Term = (_func_int **)&PTR_copy_00105d28;
  pTVar6[1]._vptr_Term = (_func_int **)pTVar6;
  Variable::timestamp = Variable::timestamp + 1;
  *(uint *)&pTVar6[2]._vptr_Term = Variable::timestamp;
  pCVar7 = (Compound *)operator_new(0x20);
  local_150 = pTVar4;
  Compound::Compound(pCVar7,f,pTVar4,pTVar6,pTVar6);
  local_180 = (Goal *)f;
  local_160 = (Clause *)operator_new(0x10);
  local_160->head = pCVar7;
  local_160->body = (Goal *)0x0;
  pTVar4 = (Term *)operator_new(0x18);
  pTVar4->_vptr_Term = (_func_int **)&PTR_copy_00105d28;
  pTVar4[1]._vptr_Term = (_func_int **)pTVar4;
  uVar1 = Variable::timestamp;
  Variable::timestamp = Variable::timestamp + 1;
  *(uint *)&pTVar4[2]._vptr_Term = Variable::timestamp;
  a2 = (Term *)operator_new(0x18);
  a2->_vptr_Term = (_func_int **)&PTR_copy_00105d28;
  a2[1]._vptr_Term = (_func_int **)a2;
  Variable::timestamp = uVar1 + 2;
  *(uint *)&a2[2]._vptr_Term = Variable::timestamp;
  a3 = (Term *)operator_new(0x18);
  a3->_vptr_Term = (_func_int **)&PTR_copy_00105d28;
  a3[1]._vptr_Term = (_func_int **)a3;
  Variable::timestamp = uVar1 + 3;
  *(uint *)&a3[2]._vptr_Term = Variable::timestamp;
  pCVar7 = (Compound *)operator_new(0x20);
  Compound::Compound(pCVar7,(Atom *)local_180,pTVar4,a2,a3);
  pCVar8 = (Compound *)operator_new(0x20);
  pCVar9 = (Compound *)operator_new(0x20);
  Compound::Compound(pCVar9,f_00,pTVar6,pTVar4);
  this = (Compound *)operator_new(0x20);
  Compound::Compound(this,f_00,pTVar6,a3);
  Compound::Compound(pCVar8,(Atom *)local_180,(Term *)pCVar9,a2,(Term *)this);
  pCVar10 = (Clause *)operator_new(0x10);
  pGVar11 = (Goal *)operator_new(0x10);
  pGVar11->head = pCVar7;
  pGVar11->tail = (Goal *)0x0;
  pCVar10->head = pCVar8;
  pCVar10->body = pGVar11;
  local_168 = pCVar10;
  a1 = (Variable *)operator_new(0x18);
  (a1->super_Term)._vptr_Term = (_func_int **)&PTR_copy_00105d28;
  a1->instance = (Term *)a1;
  uVar1 = Variable::timestamp;
  Variable::timestamp = Variable::timestamp + 1;
  a1->index = Variable::timestamp;
  a2_00 = (Variable *)operator_new(0x18);
  (a2_00->super_Term)._vptr_Term = (_func_int **)&PTR_copy_00105d28;
  a2_00->instance = (Term *)a2_00;
  Variable::timestamp = uVar1 + 2;
  a2_00->index = Variable::timestamp;
  local_170 = (Compound *)operator_new(0x20);
  pCVar8 = (Compound *)operator_new(0x20);
  pCVar7 = (Compound *)operator_new(0x20);
  pCVar9 = (Compound *)operator_new(0x20);
  Compound::Compound(pCVar9,f_00,local_178,local_150);
  Compound::Compound(pCVar7,f_00,local_158,(Term *)pCVar9);
  Compound::Compound(pCVar8,f_00,(Term *)local_188,(Term *)pCVar7);
  pCVar7 = local_170;
  Compound::Compound(local_170,(Atom *)local_180,(Term *)a1,(Term *)a2_00,(Term *)pCVar8);
  local_180 = (Goal *)operator_new(0x10);
  local_180->head = pCVar7;
  local_180->tail = (Goal *)0x0;
  pPVar12 = (Program *)operator_new(0x10);
  pPVar13 = (Program *)operator_new(0x10);
  pCVar2 = local_160;
  pCVar10 = local_168;
  pPVar13->head = local_168;
  pPVar13->tail = (Program *)0x0;
  pPVar12->head = local_160;
  pPVar12->tail = pPVar13;
  local_188 = pPVar12;
  pPVar13 = (Program *)operator_new(0x10);
  pPVar12 = (Program *)operator_new(0x10);
  pPVar12->head = pCVar2;
  pPVar12->tail = (Program *)0x0;
  pPVar13->head = pCVar10;
  pPVar13->tail = pPVar12;
  vars[0] = a1;
  vars[1] = a2_00;
  std::__cxx11::string::string<std::allocator<char>>((string *)names,"I",&local_189);
  pGVar11 = local_180;
  std::__cxx11::string::string<std::allocator<char>>((string *)(names + 1),"J",&local_18a);
  pPVar12 = local_188;
  vars_00 = (VarMapping *)operator_new(0x18);
  vars_00->vars = vars;
  vars_00->names = names;
  vars_00->count = 2;
  std::operator<<((ostream *)&std::cout,"=== Normal clause order:\n");
  Goal::solve(pGVar11,pPVar12,0,vars_00);
  std::operator<<((ostream *)&std::cout,"\n=== Reversed clause order:\n");
  Goal::solve(pGVar11,pPVar13,0,vars_00);
  lVar15 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&names[0]._M_dataplus._M_p + lVar15));
    lVar15 = lVar15 + -0x20;
  } while (lVar15 != -0x20);
  return 0;
}

Assistant:

int main()
{
    auto *atom_app = new Atom("app");
    auto *atom_cons = new Atom("cons");
    auto *nil = new Compound(new Atom("nil"));
    auto *i_1 = new Compound(new Atom("1"));
    auto *i_2 = new Compound(new Atom("2"));
    auto *i_3 = new Compound(new Atom("3"));

    //
    // Clause 1:
    //      app(nil, x, x)
    //
    auto *var_x = new Variable();
    auto *app_nil_x_x = new Compound(atom_app, nil, var_x, var_x);
    auto *clause_1 = new Clause(app_nil_x_x);

    //
    // Clause 2:
    //      app([x|l], m, [x|n]); app(l, m, n)
    //
    auto *var_l = new Variable();
    auto *var_m = new Variable();
    auto *var_n = new Variable();
    auto *app_l_m_n = new Compound(atom_app, var_l, var_m, var_n);
    auto *app_xl_m_xn = new Compound(atom_app, new Compound(atom_cons, var_x, var_l),
                                     var_m, new Compound(atom_cons, var_x, var_n));
    auto *clause_2 = new Clause(app_xl_m_xn, new Goal(app_l_m_n));

    //
    // Goal:
    //      app(i, j, [1, 2, 3])
    auto *var_i = new Variable();
    auto *var_j = new Variable();
    auto *app_i_j_123 = new Compound(atom_app, var_i, var_j,
                                     new Compound(atom_cons, i_1,
                                           new Compound(atom_cons, i_2,
                                                        new Compound(atom_cons, i_3, nil))));
    auto *goal = new Goal(app_i_j_123);

    //
    // Two test programs.
    //
    auto *prog_1 = new Program(clause_1, new Program(clause_2));
    auto *prog_2 = new Program(clause_2, new Program(clause_1));

    //
    // Two variables in the goal: I and J.
    //
    Variable *vars[] = { var_i, var_j };
    std::string names[] = { "I", "J" };
    auto *var_name_map = new VarMapping(vars, names, 2);

    //
    // Run program 1.
    //
    std::cout << "=== Normal clause order:\n";
    goal->solve(prog_1, 0, var_name_map);

    //
    // Run program 2.
    //
    std::cout << "\n=== Reversed clause order:\n";
    goal->solve(prog_2, 0, var_name_map);
    return 0;
}